

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O0

void plutovg_canvas_stroke_preserve(plutovg_canvas_t *canvas)

{
  plutovg_canvas_t *canvas_local;
  
  plutovg_rasterize(&canvas->fill_spans,canvas->path,&canvas->state->matrix,&canvas->clip_rect,
                    &canvas->state->stroke,PLUTOVG_FILL_RULE_NON_ZERO);
  if ((canvas->state->clipping & 1U) == 0) {
    plutovg_blend(canvas,&canvas->fill_spans);
  }
  else {
    plutovg_span_buffer_intersect
              (&canvas->clip_spans,&canvas->fill_spans,&canvas->state->clip_spans);
    plutovg_blend(canvas,&canvas->clip_spans);
  }
  return;
}

Assistant:

void plutovg_canvas_stroke_preserve(plutovg_canvas_t* canvas)
{
    plutovg_rasterize(&canvas->fill_spans, canvas->path, &canvas->state->matrix, &canvas->clip_rect, &canvas->state->stroke, PLUTOVG_FILL_RULE_NON_ZERO);
    if(canvas->state->clipping) {
        plutovg_span_buffer_intersect(&canvas->clip_spans, &canvas->fill_spans, &canvas->state->clip_spans);
        plutovg_blend(canvas, &canvas->clip_spans);
    } else {
        plutovg_blend(canvas, &canvas->fill_spans);
    }
}